

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsPublicationPublishTime(HelicsPublication pub,HelicsTime val,HelicsError *err)

{
  PublicationObject *pPVar1;
  Time val_00;
  
  pPVar1 = anon_unknown.dwarf_694c0::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    val_00.internalTimeCode = count_time<9,_long>::convert(val);
    helics::Publication::publish(pPVar1->pubPtr,val_00);
  }
  return;
}

Assistant:

void helicsPublicationPublishTime(HelicsPublication pub, HelicsTime val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        const helics::Time tval(val);
        pubObj->pubPtr->publish(tval);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}